

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca.cpp
# Opt level: O2

int lca(int a,int b)

{
  int iVar1;
  int iVar2;
  int l;
  uint uVar3;
  
  iVar2 = b;
  if (d[a] < d[b]) {
    iVar2 = a;
    a = b;
  }
  for (uVar3 = 0x13; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    iVar1 = pred[a][uVar3];
    if (((long)iVar1 != -1) && (d[iVar2] <= d[iVar1])) {
      a = iVar1;
    }
  }
  if (a != iVar2) {
    for (uVar3 = 0x13; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      if (pred[a][uVar3] != pred[iVar2][uVar3]) {
        iVar2 = pred[iVar2][uVar3];
        a = pred[a][uVar3];
      }
    }
    iVar2 = pred[a][0];
  }
  return iVar2;
}

Assistant:

int lca(int a, int b) {
    if (d[a] < d[b]) swap(a, b);
    per(l, 0, LOG) {
        if (pred[a][l] != -1 && d[pred[a][l]] >= d[b]) a = pred[a][l];
    }
    if (a == b) return a;
    per(l, 0, LOG) if (pred[a][l] != pred[b][l]) {
        a = pred[a][l];
        b = pred[b][l];
    }
    return pred[a][0];
}